

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat_pixel.cpp
# Opt level: O3

int ncnn::from_rgb(uchar *rgb,int w,int h,int stride,Mat *m,Allocator *allocator)

{
  float *pfVar1;
  long lVar2;
  float *pfVar3;
  int iVar4;
  int iVar5;
  float *pfVar6;
  int iVar7;
  uint uVar8;
  
  Mat::create(m,w,h,3,4,allocator);
  pfVar1 = (float *)m->data;
  if ((pfVar1 != (float *)0x0) && ((long)m->c * m->cstep != 0)) {
    iVar5 = stride + w * -3;
    iVar4 = 1;
    if (iVar5 == 0) {
      iVar4 = h;
      h = 1;
    }
    if (0 < h) {
      lVar2 = m->cstep * m->elemsize;
      pfVar6 = (float *)((long)pfVar1 + lVar2 * 2);
      pfVar3 = (float *)(lVar2 + (long)pfVar1);
      iVar7 = 0;
      do {
        uVar8 = iVar4 * w + 1;
        if (0 < iVar4 * w) {
          do {
            *pfVar1 = (float)*rgb;
            *pfVar3 = (float)rgb[1];
            *pfVar6 = (float)rgb[2];
            rgb = rgb + 3;
            pfVar1 = pfVar1 + 1;
            pfVar3 = pfVar3 + 1;
            pfVar6 = pfVar6 + 1;
            uVar8 = uVar8 - 1;
          } while (1 < uVar8);
        }
        rgb = rgb + iVar5;
        iVar7 = iVar7 + 1;
      } while (iVar7 != h);
    }
  }
  return (int)pfVar1;
}

Assistant:

static int from_rgb(const unsigned char* rgb, int w, int h, int stride, Mat& m, Allocator* allocator)
{
    m.create(w, h, 3, 4u, allocator);
    if (m.empty())
        return -100;

    const int wgap = stride - w * 3;
    if (wgap == 0)
    {
        w = w * h;
        h = 1;
    }

    float* ptr0 = m.channel(0);
    float* ptr1 = m.channel(1);
    float* ptr2 = m.channel(2);

    for (int y=0; y<h; y++)
    {
#if __ARM_NEON
        int nn = w >> 3;
        int remain = w - (nn << 3);
#else
        int remain = w;
#endif // __ARM_NEON

#if __ARM_NEON
#if __aarch64__
        for (; nn>0; nn--)
        {
            uint8x8x3_t _rgb = vld3_u8(rgb);
            uint16x8_t _r16 = vmovl_u8(_rgb.val[0]);
            uint16x8_t _g16 = vmovl_u8(_rgb.val[1]);
            uint16x8_t _b16 = vmovl_u8(_rgb.val[2]);

            float32x4_t _rlow = vcvtq_f32_u32(vmovl_u16(vget_low_u16(_r16)));
            float32x4_t _rhigh = vcvtq_f32_u32(vmovl_u16(vget_high_u16(_r16)));
            float32x4_t _glow = vcvtq_f32_u32(vmovl_u16(vget_low_u16(_g16)));
            float32x4_t _ghigh = vcvtq_f32_u32(vmovl_u16(vget_high_u16(_g16)));
            float32x4_t _blow = vcvtq_f32_u32(vmovl_u16(vget_low_u16(_b16)));
            float32x4_t _bhigh = vcvtq_f32_u32(vmovl_u16(vget_high_u16(_b16)));

            vst1q_f32(ptr0, _rlow);
            vst1q_f32(ptr0+4, _rhigh);
            vst1q_f32(ptr1, _glow);
            vst1q_f32(ptr1+4, _ghigh);
            vst1q_f32(ptr2, _blow);
            vst1q_f32(ptr2+4, _bhigh);

            rgb += 3*8;
            ptr0 += 8;
            ptr1 += 8;
            ptr2 += 8;
        }
#else
        if (nn > 0)
        {
        asm volatile(
            "0:                             \n"
            "pld        [%1, #256]          \n"
            "vld3.u8    {d0-d2}, [%1]!      \n"
            "vmovl.u8   q8, d0              \n"
            "vmovl.u8   q9, d1              \n"
            "vmovl.u8   q10, d2             \n"
            "vmovl.u16  q0, d16             \n"
            "vmovl.u16  q1, d17             \n"
            "vmovl.u16  q2, d18             \n"
            "vmovl.u16  q3, d19             \n"
            "vmovl.u16  q8, d20             \n"
            "vmovl.u16  q9, d21             \n"
            "vcvt.f32.u32   q0, q0          \n"
            "vcvt.f32.u32   q1, q1          \n"
            "vcvt.f32.u32   q2, q2          \n"
            "vcvt.f32.u32   q3, q3          \n"
            "vcvt.f32.u32   q8, q8          \n"
            "subs       %0, #1              \n"
            "vst1.f32   {d0-d3}, [%2 :128]! \n"
            "vcvt.f32.u32   q9, q9          \n"
            "vst1.f32   {d4-d7}, [%3 :128]! \n"
            "vst1.f32   {d16-d19}, [%4 :128]!\n"
            "bne        0b                  \n"
            : "=r"(nn),     // %0
              "=r"(rgb),    // %1
              "=r"(ptr0),   // %2
              "=r"(ptr1),   // %3
              "=r"(ptr2)    // %4
            : "0"(nn),
              "1"(rgb),
              "2"(ptr0),
              "3"(ptr1),
              "4"(ptr2)
            : "cc", "memory", "q0", "q1", "q2", "q3", "q8", "q9", "q10"
        );
        }
#endif // __aarch64__
#endif // __ARM_NEON
        for (; remain>0; remain--)
        {
            *ptr0 = rgb[0];
            *ptr1 = rgb[1];
            *ptr2 = rgb[2];

            rgb += 3;
            ptr0++;
            ptr1++;
            ptr2++;
        }

        rgb += wgap;
    }

    return 0;
}